

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O1

int do_open_via_path(char *dir,char *name,char *ext,char *dirresult,char **nameresult,uint size,
                    int bin,t_namelist *searchpath)

{
  t_namelist *ptVar1;
  int iVar2;
  int iVar3;
  int *fdp;
  int local_34;
  
  fdp = &local_34;
  local_34 = -1;
  iVar3 = sys_open_absolute(name,ext,dirresult,nameresult,size,size,fdp);
  if ((iVar3 == 0) &&
     (local_34 = sys_trytoopenone(dir,name,ext,dirresult,nameresult,size,(int)fdp), local_34 < 0)) {
    iVar3 = local_34;
    for (ptVar1 = (pd_maininstance.pd_stuff)->st_temppath; iVar2 = iVar3,
        ptVar1 != (t_namelist *)0x0; ptVar1 = ptVar1->nl_next) {
      iVar3 = sys_trytoopenone(ptVar1->nl_string,name,ext,dirresult,nameresult,size,(int)fdp);
      if (-1 < iVar3) {
        return iVar3;
      }
    }
    for (; local_34 = iVar2, searchpath != (t_namelist *)0x0; searchpath = searchpath->nl_next) {
      iVar3 = sys_trytoopenone(searchpath->nl_string,name,ext,dirresult,nameresult,size,(int)fdp);
      if (-1 < iVar3) {
        return iVar3;
      }
      iVar2 = local_34;
    }
    if (sys_usestdpath != 0) {
      local_34 = iVar3;
      for (ptVar1 = (pd_maininstance.pd_stuff)->st_staticpath; ptVar1 != (t_namelist *)0x0;
          ptVar1 = ptVar1->nl_next) {
        iVar3 = sys_trytoopenone(ptVar1->nl_string,name,ext,dirresult,nameresult,size,(int)fdp);
        if (-1 < iVar3) {
          return iVar3;
        }
      }
    }
    *dirresult = '\0';
    *nameresult = dirresult;
    local_34 = -1;
  }
  return local_34;
}

Assistant:

static int do_open_via_path(const char *dir, const char *name,
    const char *ext, char *dirresult, char **nameresult, unsigned int size,
    int bin, t_namelist *searchpath)
{
    t_namelist *nl;
    int fd = -1;

        /* first check if "name" is absolute (and if so, try to open) */
    if (sys_open_absolute(name, ext, dirresult, nameresult, size, bin, &fd))
        return (fd);

        /* otherwise "name" is relative; try the directory "dir" first. */
    if ((fd = sys_trytoopenone(dir, name, ext,
        dirresult, nameresult, size, bin)) >= 0)
            return (fd);

        /* next go through the temp paths from the commandline */
    for (nl = STUFF->st_temppath; nl; nl = nl->nl_next)
        if ((fd = sys_trytoopenone(nl->nl_string, name, ext,
            dirresult, nameresult, size, bin)) >= 0)
                return (fd);
        /* next look in built-in paths like "extra" */
    for (nl = searchpath; nl; nl = nl->nl_next)
        if ((fd = sys_trytoopenone(nl->nl_string, name, ext,
            dirresult, nameresult, size, bin)) >= 0)
                return (fd);
        /* next look in built-in paths like "extra" */
    if (sys_usestdpath)
        for (nl = STUFF->st_staticpath; nl; nl = nl->nl_next)
            if ((fd = sys_trytoopenone(nl->nl_string, name, ext,
                dirresult, nameresult, size, bin)) >= 0)
                    return (fd);

    *dirresult = 0;
    *nameresult = dirresult;
    return (-1);
}